

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O0

bool __thiscall
dg::llvmdg::LazyLLVMCallGraph::calls(LazyLLVMCallGraph *this,Function *F,Function *what)

{
  bool bVar1;
  FuncNode *pFVar2;
  FuncNode *this_00;
  Function **in_RDX;
  GenericCallGraph<const_llvm::Function_*> *in_RSI;
  FuncNode *in_RDI;
  FuncNode *fn2;
  FuncNode *fn1;
  LazyLLVMCallGraph *in_stack_ffffffffffffffd0;
  undefined1 local_1;
  
  bVar1 = hasFn(in_stack_ffffffffffffffd0,(Function *)in_RDI);
  if (!bVar1) {
    _populateCalledFunctions((LazyLLVMCallGraph *)F,what);
  }
  pFVar2 = GenericCallGraph<const_llvm::Function_*>::get(in_RSI,in_RDX);
  this_00 = GenericCallGraph<const_llvm::Function_*>::get(in_RSI,in_RDX);
  if ((pFVar2 == (FuncNode *)0x0) || (this_00 == (FuncNode *)0x0)) {
    local_1 = false;
  }
  else {
    local_1 = GenericCallGraph<const_llvm::Function_*>::FuncNode::calls(this_00,in_RDI);
  }
  return local_1;
}

Assistant:

bool calls(const llvm::Function *F, const llvm::Function *what) override {
        if (!hasFn(F)) {
            _populateCalledFunctions(F);
        }
        auto fn1 = _cg.get(F);
        auto fn2 = _cg.get(what);
        if (fn1 && fn2) {
            return fn1->calls(fn2);
        }
        return false;
    }